

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

void __thiscall wasm::TranslateToFuzzReader::setupMemory(TranslateToFuzzReader *this)

{
  Random *pRVar1;
  _Head_base<0UL,_wasm::Memory_*,_false> _Var2;
  TranslateToFuzzReader *pTVar3;
  DataSegment *pDVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  Module *pMVar7;
  char *pcVar8;
  Const *pCVar9;
  bool isPassive;
  bool isPassive_00;
  size_t i;
  pointer pcVar10;
  ulong uVar11;
  Name name;
  Name memory_00;
  Name memory_01;
  string_view sVar12;
  undefined1 auVar13 [16];
  Name NVar14;
  Literal local_98;
  Literal local_80;
  ulong local_68;
  Builder *local_60;
  pointer local_58;
  int local_4c;
  TranslateToFuzzReader *local_48;
  char local_39;
  DataSegment *local_38;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> memory;
  
  pMVar7 = this->wasm;
  local_58 = (pMVar7->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (local_58 ==
      (pMVar7->memories).
      super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    sVar12 = (string_view)wasm::IString::interned(1,"0",0);
    local_38 = (DataSegment *)operator_new(0x58);
    *(undefined8 *)&(local_38->super_Named).hasExplicitName = 0;
    (local_38->memory).super_IString.str._M_len = 0;
    (local_38->memory).super_IString.str._M_str = (char *)0x0;
    *(undefined8 *)&local_38->isPassive = 0;
    local_38->offset = (Expression *)0x0;
    (local_38->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    (local_38->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    (local_38->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    (local_38->super_Named).name.super_IString.str = sVar12;
    (local_38->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x10000;
    local_38[1].super_Named.name.super_IString.str._M_len = 2;
    pRVar1 = &this->random;
    uVar5 = Random::upTo(pRVar1,10);
    (local_38->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)(ulong)(uVar5 + 1);
    uVar5 = Random::upTo(pRVar1,2);
    pcVar10 = (pointer)0xffffffffffffffff;
    if (uVar5 == 0) {
      pcVar10 = (local_38->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar5 = Random::upTo(pRVar1,4);
      pcVar10 = pcVar10 + uVar5;
    }
    (local_38->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_finish = pcVar10;
    if (((this->wasm->features).features & 0x800) != 0) {
      uVar5 = Random::upTo(pRVar1,2);
      if (uVar5 == 0) {
        local_38[1].super_Named.name.super_IString.str._M_len = 3;
      }
    }
    wasm::Module::addMemory((unique_ptr *)this->wasm);
    if (local_38 != (DataSegment *)0x0) {
      operator_delete(local_38,0x58);
    }
    pMVar7 = this->wasm;
    local_58 = (pMVar7->memories).
               super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  }
  local_48 = this;
  if (((pMVar7->features).features & 0x10) == 0) {
    pRVar1 = &this->random;
    uVar5 = Random::upTo(pRVar1,(uint)((pMVar7->dataSegments).
                                       super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start ==
                                      (pMVar7->dataSegments).
                                      super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish) * 8 + 2);
    if (uVar5 != 0) {
      auVar13 = wasm::IString::interned(0,"",0);
      memory_00.super_IString.str._M_len = auVar13._8_8_;
      pcVar8 = (char *)wasm::IString::interned(0,"",0);
      name.super_IString.str._M_str = auVar13._0_8_;
      name.super_IString.str._M_len = (size_t)&local_38;
      memory_00.super_IString.str._M_str = pcVar8;
      Builder::makeDataSegment
                (name,memory_00,isPassive,(Expression *)0x0,(char *)0x0,(Address)0x1b90f3);
      _Var2._M_head_impl =
           (local_58->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
           _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
           super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
      pcVar8 = *(char **)((long)&(_Var2._M_head_impl)->super_Importable + 8);
      (local_38->memory).super_IString.str._M_len =
           *(size_t *)&(_Var2._M_head_impl)->super_Importable;
      (local_38->memory).super_IString.str._M_str = pcVar8;
      Literal::makeFromInt32
                (&local_80,0,
                 (Type)(((local_58->_M_t).
                         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                         super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->addressType).id
                );
      pTVar3 = local_48;
      pCVar9 = Builder::makeConst(&local_48->builder,&local_80);
      local_38->offset = (Expression *)pCVar9;
      wasm::Literal::~Literal(&local_80);
      pDVar4 = local_38;
      pMVar7 = pTVar3->wasm;
      NVar14 = Name::fromInt(0);
      sVar12 = (string_view)Names::getValidDataSegmentName(pMVar7,NVar14);
      (pDVar4->super_Named).name.super_IString.str = sVar12;
      (pDVar4->super_Named).hasExplicitName = false;
      uVar5 = Random::upTo(pRVar1,(int)(pTVar3->fuzzParams->super_FuzzParams).USABLE_MEMORY.addr * 2
                          );
      if (uVar5 != 0) {
        uVar11 = (ulong)uVar5;
        do {
          uVar5 = Random::upTo(pRVar1,0x200);
          local_39 = (char)uVar5;
          if (0xff < uVar5) {
            local_39 = '\0';
          }
          std::vector<char,_std::allocator<char>_>::emplace_back<char>(&local_38->data,&local_39);
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
      }
      wasm::Module::addDataSegment((unique_ptr *)pTVar3->wasm);
      if (local_38 != (DataSegment *)0x0) {
        std::default_delete<wasm::DataSegment>::operator()
                  ((default_delete<wasm::DataSegment> *)&local_38,local_38);
      }
    }
  }
  else {
    pRVar1 = &this->random;
    uVar5 = Random::upTo(pRVar1,8);
    local_68 = 1;
    if ((this->wasm->dataSegments).
        super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->wasm->dataSegments).
        super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_68 = (ulong)uVar5;
    }
    if (uVar5 != 0) {
      local_68 = (ulong)uVar5;
    }
    if (local_68 != 0) {
      local_60 = &local_48->builder;
      local_4c = 0;
      i = 0;
      do {
        auVar13 = wasm::IString::interned(0,"",0);
        memory_01.super_IString.str._M_len = auVar13._8_8_;
        pcVar8 = (char *)wasm::IString::interned(0,"",0);
        NVar14.super_IString.str._M_str = auVar13._0_8_;
        NVar14.super_IString.str._M_len = (size_t)&local_38;
        memory_01.super_IString.str._M_str = pcVar8;
        Builder::makeDataSegment
                  (NVar14,memory_01,isPassive_00,(Expression *)0x0,(char *)0x0,(Address)0x1b90f3);
        pDVar4 = local_38;
        pMVar7 = local_48->wasm;
        NVar14 = Name::fromInt(i);
        sVar12 = (string_view)Names::getValidDataSegmentName(pMVar7,NVar14);
        (pDVar4->super_Named).name.super_IString.str = sVar12;
        (pDVar4->super_Named).hasExplicitName = false;
        uVar5 = Random::upTo(pRVar1,2);
        local_38->isPassive = uVar5 != 0;
        uVar5 = Random::upTo(pRVar1,(int)(local_48->fuzzParams->super_FuzzParams).USABLE_MEMORY.addr
                                    * 2);
        std::vector<char,_std::allocator<char>_>::resize(&local_38->data,(ulong)uVar5);
        if (uVar5 != 0) {
          uVar11 = 0;
          do {
            uVar6 = Random::upTo(pRVar1,0x200);
            (local_38->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar11] = (char)uVar6;
            uVar11 = uVar11 + 1;
          } while (uVar5 != uVar11);
        }
        if (local_38->isPassive == false) {
          Literal::makeFromInt32
                    (&local_98,local_4c,
                     (Type)(((local_58->_M_t).
                             super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                             .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->
                           addressType).id);
          pCVar9 = Builder::makeConst(local_60,&local_98);
          local_38->offset = (Expression *)pCVar9;
          wasm::Literal::~Literal(&local_98);
          local_4c = local_4c + uVar5;
          _Var2._M_head_impl =
               (local_58->_M_t).
               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
               super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
          pcVar8 = *(char **)((long)&(_Var2._M_head_impl)->super_Importable + 8);
          (local_38->memory).super_IString.str._M_len =
               *(size_t *)&(_Var2._M_head_impl)->super_Importable;
          (local_38->memory).super_IString.str._M_str = pcVar8;
        }
        wasm::Module::addDataSegment((unique_ptr *)local_48->wasm);
        if (local_38 != (DataSegment *)0x0) {
          std::default_delete<wasm::DataSegment>::operator()
                    ((default_delete<wasm::DataSegment> *)&local_38,local_38);
        }
        i = i + 1;
      } while (i != local_68);
    }
  }
  return;
}

Assistant:

void TranslateToFuzzReader::setupMemory() {
  // Add a memory, if one does not already exist.
  if (wasm.memories.empty()) {
    auto memory = Builder::makeMemory("0");
    // Add at least one page of memory.
    memory->initial = 1 + upTo(10);
    // Make the max potentially higher, or unlimited.
    if (oneIn(2)) {
      memory->max = memory->initial + upTo(4);
    } else {
      memory->max = Memory::kUnlimitedSize;
    }
    // Fuzz wasm64 when possible, sometimes.
    if (wasm.features.hasMemory64() && oneIn(2)) {
      memory->addressType = Type::i64;
    }
    wasm.addMemory(std::move(memory));
  }

  auto& memory = wasm.memories[0];
  if (wasm.features.hasBulkMemory()) {
    size_t numSegments = upTo(8);
    // need at least one segment for memory.inits
    if (wasm.dataSegments.empty() && !numSegments) {
      numSegments = 1;
    }
    size_t memCovered = 0;
    for (size_t i = 0; i < numSegments; i++) {
      auto segment = builder.makeDataSegment();
      segment->setName(Names::getValidDataSegmentName(wasm, Name::fromInt(i)),
                       false);
      segment->isPassive = bool(upTo(2));
      size_t segSize = upTo(fuzzParams->USABLE_MEMORY * 2);
      segment->data.resize(segSize);
      for (size_t j = 0; j < segSize; j++) {
        segment->data[j] = upTo(512);
      }
      if (!segment->isPassive) {
        segment->offset = builder.makeConst(
          Literal::makeFromInt32(memCovered, memory->addressType));
        memCovered += segSize;
        segment->memory = memory->name;
      }
      wasm.addDataSegment(std::move(segment));
    }
  } else {
    // init some data, especially if none exists before
    if (!oneIn(wasm.dataSegments.empty() ? 10 : 2)) {
      auto segment = builder.makeDataSegment();
      segment->memory = memory->name;
      segment->offset =
        builder.makeConst(Literal::makeFromInt32(0, memory->addressType));
      segment->setName(Names::getValidDataSegmentName(wasm, Name::fromInt(0)),
                       false);
      auto num = upTo(fuzzParams->USABLE_MEMORY * 2);
      for (size_t i = 0; i < num; i++) {
        auto value = upTo(512);
        segment->data.push_back(value >= 256 ? 0 : (value & 0xff));
      }
      wasm.addDataSegment(std::move(segment));
    }
  }
}